

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableES5ArrayWalker::RecyclableES5ArrayWalker
          (RecyclableES5ArrayWalker *this,ScriptContext *_scriptContext,Var _instance,
          Var _originalInstance)

{
  (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext = _scriptContext;
  (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance = _instance;
  (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.originalInstance =
       _originalInstance;
  (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.fakeGroupObjectWalkerList =
       (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList =
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.innerArrayObjectWalker =
       (RecyclableArrayWalker *)0x0;
  (this->super_RecyclableArrayWalker).indexedItemCount = 0;
  (this->super_RecyclableArrayWalker).pAbsoluteIndexList =
       (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       0x0;
  (this->super_RecyclableArrayWalker).fOnlyOwnProperties = false;
  (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.super_IDiagObjectModelWalkerBase.
  _vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_0137f4a8;
  return;
}

Assistant:

RecyclableES5ArrayWalker::RecyclableES5ArrayWalker(ScriptContext* _scriptContext, Var _instance, Var _originalInstance)
        : RecyclableArrayWalker(_scriptContext, _instance, _originalInstance)
    {
    }